

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O1

void __thiscall
duckdb::ChunkVectorInfo::CommitDelete
          (ChunkVectorInfo *this,transaction_t commit_id,DeleteInfo *info)

{
  ulong uVar1;
  uint16_t *puVar2;
  
  if (info->is_consecutive == true) {
    if (info->count != 0) {
      uVar1 = 0;
      do {
        this->deleted[uVar1] = commit_id;
        uVar1 = uVar1 + 1;
      } while (uVar1 < info->count);
    }
  }
  else {
    puVar2 = DeleteInfo::GetRows(info);
    if (info->count != 0) {
      uVar1 = 0;
      do {
        this->deleted[puVar2[uVar1]] = commit_id;
        uVar1 = uVar1 + 1;
      } while (uVar1 < info->count);
    }
  }
  return;
}

Assistant:

void ChunkVectorInfo::CommitDelete(transaction_t commit_id, const DeleteInfo &info) {
	if (info.is_consecutive) {
		for (idx_t i = 0; i < info.count; i++) {
			deleted[i] = commit_id;
		}
	} else {
		auto rows = info.GetRows();
		for (idx_t i = 0; i < info.count; i++) {
			deleted[rows[i]] = commit_id;
		}
	}
}